

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dtls-Example.cpp
# Opt level: O3

void ClientThread(bool *bStop)

{
  int iVar1;
  int *piVar2;
  bool bIsClosed;
  SslUdpSocket sock;
  char local_139;
  BaseSocket local_138;
  timespec local_128;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  _Manager_type local_80;
  _Any_data local_70;
  _Manager_type local_60;
  _Any_data local_50;
  _Manager_type local_40;
  _Any_data local_30;
  _Manager_type local_20;
  
  SslUdpSocket::SslUdpSocket((SslUdpSocket *)&local_138);
  local_139 = '\0';
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:97:28)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:97:28)>
             ::_M_manager;
  BaseSocket::BindErrorFunction
            ((function<void_(BaseSocket_*)> *)&local_30,&local_138,
             (function<void_(BaseSocket_*)> *)&local_f8);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  local_b0._8_8_ = 0;
  local_b0._M_unused._M_object = &local_139;
  local_98 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:98:28)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(BaseSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:98:28)>
             ::_M_manager;
  BaseSocket::BindCloseFunction
            ((function<void_(BaseSocket_*)> *)&local_50,&local_138,
             (function<void_(BaseSocket_*)> *)&local_b0);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
  }
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<void_(UdpSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:99:32)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(UdpSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:99:32)>
              ::_M_manager;
  UdpSocket::BindFuncBytesReceived
            ((function<void_(UdpSocket_*)> *)&local_70,(UdpSocket *)&local_138,
             (function<void_(UdpSocket_*)> *)&local_118);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<void_(UdpSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:124:30)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(UdpSocket_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/Dtls-Example.cpp:124:30)>
             ::_M_manager;
  local_d0._M_unused._M_object = &local_138;
  SslUdpSocket::BindFuncSslInitDone
            ((function<void_(UdpSocket_*)> *)&local_90,(SslUdpSocket *)&local_138,
             (function<void_(UdpSocket_*)> *)&local_d0);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  SslUdpSocket::AddCertificate
            ((SslUdpSocket *)&local_138,"certs/client-cert.crt","certs/client-key.pem");
  SslUdpSocket::CreateClientSide
            ((SslUdpSocket *)&local_138,"0.0.0.0",0x777,"127.0.0.1:3461",(char *)0x0);
  if (*bStop == false) {
    do {
      local_128.tv_sec = 0;
      local_128.tv_nsec = 10000000;
      do {
        iVar1 = nanosleep(&local_128,&local_128);
        if (iVar1 != -1) break;
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    } while (*bStop == false);
  }
  SslUdpSocket::Close((SslUdpSocket *)&local_138);
  if (local_139 == '\0') {
    do {
      local_128.tv_sec = 0;
      local_128.tv_nsec = 10000000;
      do {
        iVar1 = nanosleep(&local_128,&local_128);
        if (iVar1 != -1) break;
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    } while (local_139 == '\0');
  }
  BaseSocket::~BaseSocket(&local_138);
  return;
}

Assistant:

void ClientThread(const bool* bStop)
{
    SslUdpSocket sock;
    bool bIsClosed = false;

    // 4 callback function to handle the client socket events
    sock.BindErrorFunction([&](BaseSocket*) { cout << "Client: socket error" << endl; });
    sock.BindCloseFunction([&](BaseSocket*) { cout << "Client: socket closing" << endl; bIsClosed = true; });
    sock.BindFuncBytesReceived([&](UdpSocket* pUdpSocket)
    {
        const size_t nAvailable = pUdpSocket->GetBytesAvailable();

        auto spBuffer = make_unique<uint8_t[]>(nAvailable + 1);

        string strFrom;
        const size_t nRead = pUdpSocket->Read(spBuffer.get(), nAvailable, strFrom);

        if (nRead > 0)
        {
            string strRec(nRead, 0);
            copy(&spBuffer[0], &spBuffer[nRead], &strRec[0]);

            stringstream strOutput;
            const auto tNow = chrono::system_clock::to_time_t(chrono::system_clock::now());
            struct tm stTime;
            if (localtime_s(&stTime, &tNow) == 0)
                strOutput << put_time(&stTime, "%a, %d %b %Y %H:%M:%S") << " - ";
            strOutput << strFrom.c_str() << " - Client received: " << nRead << " Bytes, \"" << strRec << "\"" << endl;

            cout << strOutput.str();
        }
    });

    sock.BindFuncSslInitDone([&](UdpSocket* pUdpSocket)
    {
        sock.Write("Hallo World", 11, "127.0.0.1:3461");
    });

    sock.AddCertificate("certs/client-cert.crt", "certs/client-key.pem");

    const bool bCreated = sock.CreateClientSide("0.0.0.0", 1911, "127.0.0.1:3461");

    while (*bStop == false)
    {
        this_thread::sleep_for(chrono::milliseconds(10));
    }

    sock.Close();
    while (bIsClosed == false)
        this_thread::sleep_for(chrono::milliseconds(10));
}